

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# czmap.c
# Opt level: O0

czmap_copy_status czmap_copy(czmap *src,czmap *dst)

{
  czmap *local_30;
  czmap_inserter_data idata;
  czmap *dst_local;
  czmap *src_local;
  
  idata.dst._0_1_ = '\0';
  local_30 = dst;
  idata._8_8_ = dst;
  czmap_foreach(src,czmap_internal_inserter,&local_30);
  src_local._4_4_ = (czmap_copy_status)((char)idata.dst != '\0');
  return src_local._4_4_;
}

Assistant:

czmap_copy_status czmap_copy(czmap * src, czmap * dst) {
    czmap_inserter_data idata;
    idata.dst = dst;
    idata.nospace = 0;

    /* inserter will find space. idata.nospace will be = 1 if
     * it failed somewhere */
    czmap_foreach(src, czmap_internal_inserter, &idata);

    if (idata.nospace == 0) return CZMAP_COPY_OK;
    else return CZMAP_COPY_NOSPACE;
}